

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

void vkt::api::anon_unknown_1::addCases<vkt::api::(anonymous_namespace)::Framebuffer>
               (MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *group,
               CaseDescription<vkt::api::(anonymous_namespace)::Framebuffer> *cases)

{
  char *__s;
  TestCaseGroup *pTVar1;
  allocator<char> local_79;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [32];
  NamedParameters<vkt::api::(anonymous_namespace)::Framebuffer> *local_20;
  NamedParameters<vkt::api::(anonymous_namespace)::Framebuffer> *cur;
  CaseDescription<vkt::api::(anonymous_namespace)::Framebuffer> *cases_local;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *group_local;
  
  cur = (NamedParameters<vkt::api::(anonymous_namespace)::Framebuffer> *)cases;
  cases_local = (CaseDescription<vkt::api::(anonymous_namespace)::Framebuffer> *)group;
  for (local_20 = cases->paramsBegin;
      local_20 != (NamedParameters<vkt::api::(anonymous_namespace)::Framebuffer> *)cur[1].name;
      local_20 = local_20 + 1) {
    pTVar1 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
             get((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                 cases_local);
    __s = local_20->name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_40,__s,&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_78,"",&local_79);
    addFunctionCase<vkt::api::(anonymous_namespace)::Framebuffer::Parameters>
              (pTVar1,local_40,local_78,cur->name);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator(&local_79);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return;
}

Assistant:

void addCases (const MovePtr<tcu::TestCaseGroup>& group, const CaseDescription<Object>& cases)
{
	for (const NamedParameters<Object>* cur = cases.paramsBegin; cur != cases.paramsEnd; ++cur)
		addFunctionCase(group.get(), cur->name, "", cases.function, cur->parameters);
}